

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softplus.cpp
# Opt level: O3

int __thiscall ncnn::Softplus::forward_inplace(Softplus *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  void *pvVar7;
  float fVar8;
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w;
    pvVar7 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    lVar5 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar4 = 0;
        do {
          fVar8 = expf(*(float *)((long)pvVar7 + uVar4 * 4));
          fVar8 = logf(fVar8 + 1.0);
          *(float *)((long)pvVar7 + uVar4 * 4) = fVar8;
          uVar4 = uVar4 + 1;
        } while (uVar6 != uVar4);
      }
      lVar5 = lVar5 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    } while (lVar5 != iVar1);
  }
  return 0;
}

Assistant:

int Softplus::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        for (int i = 0; i < size; i++)
        {
            ptr[i] = log(exp(ptr[i]) + 1.0f);
        }
    }

    return 0;
}